

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_grammar.cpp
# Opt level: O3

spv_result_t __thiscall
spvtools::AssemblyGrammar::lookupSpecConstantOpcode(AssemblyGrammar *this,char *name,Op *opcode)

{
  int iVar1;
  spv_result_t sVar2;
  long lVar3;
  ulong uVar4;
  Op *pOVar5;
  
  uVar4 = 0x10;
  lVar3 = 0;
  do {
    iVar1 = strcmp(name,*(char **)((long)&PTR_anon_var_dwarf_16c168b_003e0678 + lVar3));
    if (iVar1 == 0) goto LAB_002887fc;
    iVar1 = strcmp(name,*(char **)((long)&PTR_anon_var_dwarf_16c16ae_003e0688 + lVar3));
    if (iVar1 == 0) {
      if (lVar3 == 0x3c0) {
        return SPV_ERROR_INVALID_LOOKUP;
      }
      pOVar5 = (Op *)((long)&DAT_003e0680 + lVar3);
      goto LAB_002887ff;
    }
    iVar1 = strcmp(name,*(char **)((long)&PTR_anon_var_dwarf_16c16b8_003e0698 + lVar3));
    if (iVar1 == 0) {
      lVar3 = lVar3 + 0x20;
LAB_002887fc:
      pOVar5 = (Op *)((long)&(anonymous_namespace)::kOpSpecConstantOpcodes + lVar3);
      goto LAB_002887ff;
    }
    iVar1 = strcmp(name,*(char **)((long)&PTR_anon_var_dwarf_16c16ce_003e06a8 + lVar3));
    if (iVar1 == 0) {
      lVar3 = lVar3 + 0x30;
      goto LAB_002887fc;
    }
    lVar3 = lVar3 + 0x40;
    uVar4 = uVar4 - 1;
  } while (1 < uVar4);
  iVar1 = strcmp(name,"CooperativeMatrixLengthKHR");
  sVar2 = SPV_ERROR_INVALID_LOOKUP;
  if (iVar1 == 0) {
    pOVar5 = &DAT_003e0a30;
LAB_002887ff:
    *opcode = *pOVar5;
    sVar2 = SPV_SUCCESS;
  }
  return sVar2;
}

Assistant:

spv_result_t AssemblyGrammar::lookupSpecConstantOpcode(const char* name,
                                                       spv::Op* opcode) const {
  const auto* last = kOpSpecConstantOpcodes + kNumOpSpecConstantOpcodes;
  const auto* found =
      std::find_if(kOpSpecConstantOpcodes, last,
                   [name](const SpecConstantOpcodeEntry& entry) {
                     return 0 == strcmp(name, entry.name);
                   });
  if (found == last) return SPV_ERROR_INVALID_LOOKUP;
  *opcode = found->opcode;
  return SPV_SUCCESS;
}